

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AggregateOptionFinder::FindExtension
          (AggregateOptionFinder *this,Message *message,string *name)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  Descriptor *this_00;
  FieldDescriptor *this_01;
  Descriptor *pDVar4;
  long in_RDI;
  Symbol SVar5;
  FieldDescriptor *extension;
  int i;
  Descriptor *foreign_type;
  Symbol result;
  Descriptor *descriptor;
  bool in_stack_000000e3;
  ResolveMode in_stack_000000e4;
  string *in_stack_000000e8;
  string *in_stack_000000f0;
  DescriptorBuilder *in_stack_000000f8;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar6;
  FieldDescriptor *this_02;
  int local_44;
  anon_union_8_8_13f84498_for_Symbol_2 local_8;
  
  assert_mutex_held((DescriptorPool *)0x659eb9);
  this_00 = Message::GetDescriptor
                      ((Message *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  this_02 = *(FieldDescriptor **)(in_RDI + 8);
  Descriptor::full_name_abi_cxx11_(this_00);
  SVar5 = LookupSymbolNoPlaceholder
                    (in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e4,
                     in_stack_000000e3);
  local_8 = SVar5.field_1;
  if ((SVar5.type != FIELD) ||
     (bVar1 = FieldDescriptor::is_extension(local_8.field_descriptor), !bVar1)) {
    if (SVar5.type == MESSAGE) {
      Descriptor::options(this_00);
      bVar1 = MessageOptions::message_set_wire_format((MessageOptions *)0x659f53);
      if (bVar1) {
        local_44 = 0;
        while (iVar6 = local_44, iVar2 = Descriptor::extension_count(local_8.descriptor),
              iVar6 < iVar2) {
          this_01 = Descriptor::extension(local_8.descriptor,local_44);
          pDVar4 = FieldDescriptor::containing_type(this_01);
          if ((((pDVar4 == this_00) &&
               (TVar3 = FieldDescriptor::type(this_02), TVar3 == TYPE_MESSAGE)) &&
              (bVar1 = FieldDescriptor::is_optional((FieldDescriptor *)0x659fc7), bVar1)) &&
             (pDVar4 = FieldDescriptor::message_type
                                 ((FieldDescriptor *)CONCAT44(iVar6,in_stack_ffffffffffffff90)),
             pDVar4 == local_8.descriptor)) {
            return this_01;
          }
          local_44 = local_44 + 1;
        }
      }
    }
    local_8.descriptor = (Descriptor *)0x0;
  }
  return (FieldDescriptor *)local_8.descriptor;
}

Assistant:

const FieldDescriptor* FindExtension(Message* message,
                                       const std::string& name) const override {
    assert_mutex_held(builder_->pool_);
    const Descriptor* descriptor = message->GetDescriptor();
    Symbol result =
        builder_->LookupSymbolNoPlaceholder(name, descriptor->full_name());
    if (result.type == Symbol::FIELD &&
        result.field_descriptor->is_extension()) {
      return result.field_descriptor;
    } else if (result.type == Symbol::MESSAGE &&
               descriptor->options().message_set_wire_format()) {
      const Descriptor* foreign_type = result.descriptor;
      // The text format allows MessageSet items to be specified using
      // the type name, rather than the extension identifier. If the symbol
      // lookup returned a Message, and the enclosing Message has
      // message_set_wire_format = true, then return the message set
      // extension, if one exists.
      for (int i = 0; i < foreign_type->extension_count(); i++) {
        const FieldDescriptor* extension = foreign_type->extension(i);
        if (extension->containing_type() == descriptor &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() &&
            extension->message_type() == foreign_type) {
          // Found it.
          return extension;
        }
      }
    }
    return nullptr;
  }